

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::insert_hint_unique<std::pair<int,int>const&>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
          *this,iterator position,key_type *key,pair<int,_int> *args)

{
  long lVar1;
  int iVar2;
  btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  *pbVar3;
  iterator iVar4;
  iterator prev;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_60;
  pair<int,_int> *local_50;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
  local_48;
  
  pbVar3 = position.node;
  iVar2 = position.position;
  local_60.node = pbVar3;
  local_60.position = iVar2;
  if (*(long *)(this + 0x10) == 0) {
LAB_001fce5e:
    insert_unique<std::pair<int,int>const&>(__return_storage_ptr__,this,key,args);
  }
  else {
    iVar4 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)this);
    if (iVar4.node == pbVar3 && iVar4.position == iVar2) {
LAB_001fcd56:
      local_48._12_4_ = local_60._12_4_;
      local_48.position = local_60.position;
      local_48.node = local_60.node;
      iVar4 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)this);
      if (iVar4.node != pbVar3 || iVar4.position != iVar2) {
        local_50 = args;
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
        ::decrement(&local_48);
        if (((ulong)local_48.node & 7) != 0) {
LAB_001fce81:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned char, std::pair<int, int>, phmap::priv::btree_node<phmap::priv::set_params<std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        args = local_50;
        if ((key->first <= *(int *)(local_48.node + (long)local_48.position * 8 + 0xc)) &&
           ((key->first < *(int *)(local_48.node + (long)local_48.position * 8 + 0xc) ||
            (key->second <= *(int *)(local_48.node + (long)local_48.position * 8 + 0x10)))))
        goto LAB_001fce5e;
      }
    }
    else {
      if (((undefined1  [16])position & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_001fce81;
      lVar1 = (long)iVar2;
      if (key->first < *(int *)(pbVar3 + lVar1 * 8 + 0xc)) goto LAB_001fcd56;
      if (key->first <= *(int *)(pbVar3 + lVar1 * 8 + 0xc)) {
        if (key->second < *(int *)(pbVar3 + lVar1 * 8 + 0x10)) goto LAB_001fcd56;
        if (key->second <= *(int *)(pbVar3 + lVar1 * 8 + 0x10)) {
          (__return_storage_ptr__->first).node = local_60.node;
          *(ulong *)&(__return_storage_ptr__->first).position =
               CONCAT44(local_60._12_4_,local_60.position);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_std::pair<int,_int>_&,_std::pair<int,_int>_*>
      ::increment(&local_60);
      iVar4 = btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)this);
      pbVar3 = local_60.node;
      iVar2 = local_60.position;
      if (local_60.node != iVar4.node || local_60.position != iVar4.position) {
        if (((ulong)local_60.node & 7) != 0) goto LAB_001fce81;
        if ((*(int *)(local_60.node + (long)local_60.position * 8 + 0xc) <= key->first) &&
           ((*(int *)(local_60.node + (long)local_60.position * 8 + 0xc) < key->first ||
            (*(int *)(local_60.node + (long)local_60.position * 8 + 0x10) <= key->second))))
        goto LAB_001fce5e;
      }
    }
    iVar4.position = iVar2;
    iVar4.node = pbVar3;
    iVar4._12_4_ = 0;
    iVar4 = internal_emplace<std::pair<int,int>const&>(this,iVar4,args);
    (__return_storage_ptr__->first).node = iVar4.node;
    (__return_storage_ptr__->first).position = iVar4.position;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }